

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O2

SUNErrCode SUNMatCopyOps(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_Ops p_Var1;
  SUNMatrix_Ops p_Var2;
  _func_SUNMatrix_SUNMatrix *p_Var3;
  _func_SUNErrCode_SUNMatrix *p_Var4;
  _func_SUNErrCode_sunrealtype_SUNMatrix_SUNMatrix *p_Var5;
  _func_SUNErrCode_SUNMatrix_long_ptr_long_ptr *p_Var6;
  
  p_Var1 = A->ops;
  p_Var2 = B->ops;
  p_Var3 = p_Var1->clone;
  p_Var2->getid = p_Var1->getid;
  p_Var2->clone = p_Var3;
  p_Var4 = p_Var1->zero;
  p_Var2->destroy = p_Var1->destroy;
  p_Var2->zero = p_Var4;
  p_Var5 = p_Var1->scaleadd;
  p_Var2->copy = p_Var1->copy;
  p_Var2->scaleadd = p_Var5;
  p_Var4 = p_Var1->matvecsetup;
  p_Var2->scaleaddi = p_Var1->scaleaddi;
  p_Var2->matvecsetup = p_Var4;
  p_Var6 = p_Var1->space;
  p_Var2->matvec = p_Var1->matvec;
  p_Var2->space = p_Var6;
  return 0;
}

Assistant:

SUNErrCode SUNMatCopyOps(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  /* Check that ops structures exist */
  SUNAssert(A && A->ops, SUN_ERR_ARG_CORRUPT);
  SUNAssert(B && B->ops, SUN_ERR_ARG_CORRUPT);

  /* Copy ops from A to B */
  B->ops->getid       = A->ops->getid;
  B->ops->clone       = A->ops->clone;
  B->ops->destroy     = A->ops->destroy;
  B->ops->zero        = A->ops->zero;
  B->ops->copy        = A->ops->copy;
  B->ops->scaleadd    = A->ops->scaleadd;
  B->ops->scaleaddi   = A->ops->scaleaddi;
  B->ops->matvecsetup = A->ops->matvecsetup;
  B->ops->matvec      = A->ops->matvec;
  B->ops->space       = A->ops->space;

  return (0);
}